

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.hpp
# Opt level: O0

scoped_dfs_traverser * __thiscall
clipp::detail::scoped_dfs_traverser::operator++(scoped_dfs_traverser *this)

{
  bool bVar1;
  child *this_00;
  child_t<clipp::parameter,_clipp::group> *this_01;
  group *this_02;
  scoped_dfs_traverser *in_RDI;
  group *unaff_retaddr;
  depth_first_traverser *in_stack_00000008;
  group *g;
  depth_first_traverser *in_stack_00000028;
  depth_first_traverser *in_stack_ffffffffffffffd8;
  scoped_dfs_traverser *this_03;
  scoped_dfs_traverser *local_8;
  
  this_03 = in_RDI;
  bVar1 = group::depth_first_traverser::operator_cast_to_bool((depth_first_traverser *)0x19c198);
  local_8 = in_RDI;
  if (bVar1) {
    bVar1 = group::depth_first_traverser::is_last_in_path(in_stack_00000008);
    if (bVar1) {
      return_to_outermost_scope(in_RDI);
      local_8 = in_RDI;
    }
    else {
      if (((in_RDI->ignoreBlocks_ & 1U) != 0) ||
         (bVar1 = matched((scoped_dfs_traverser *)0x19c1ec), bVar1)) {
        group::depth_first_traverser::operator++(in_stack_ffffffffffffffd8);
      }
      else {
        this_00 = group::depth_first_traverser::operator->((depth_first_traverser *)0x19c20b);
        bVar1 = group::child_t<clipp::parameter,_clipp::group>::is_group(this_00);
        if (bVar1) {
          group::depth_first_traverser::operator++(in_stack_ffffffffffffffd8);
        }
        else {
          this_01 = (child_t<clipp::parameter,_clipp::group> *)
                    group::depth_first_traverser::outermost_blocking_group_fully_explored
                              (in_stack_00000028);
          if ((this_01 == (child_t<clipp::parameter,_clipp::group> *)0x0) ||
             (bVar1 = group::depth_first_traverser::is_inside(in_stack_00000008,unaff_retaddr),
             bVar1)) {
            group::depth_first_traverser::operator->((depth_first_traverser *)0x19c284);
            bVar1 = group::child_t<clipp::parameter,_clipp::group>::blocking(this_01);
            if (bVar1) {
              this_02 = group::depth_first_traverser::parent((depth_first_traverser *)0x19c29c);
              bVar1 = group::exclusive(this_02);
              if (bVar1) {
                group::depth_first_traverser::next_sibling((depth_first_traverser *)this_01);
              }
              else {
                group::depth_first_traverser::next_after_siblings((depth_first_traverser *)this_01);
              }
              bVar1 = group::depth_first_traverser::operator_cast_to_bool
                                ((depth_first_traverser *)0x19c2ca);
              if (!bVar1) {
                return_to_outermost_scope(in_RDI);
              }
            }
            else {
              group::depth_first_traverser::operator++(in_stack_ffffffffffffffd8);
            }
          }
          else {
            group::depth_first_traverser::back_to_ancestor
                      ((depth_first_traverser *)this_01,(group *)in_RDI);
            group::depth_first_traverser::next_after_siblings((depth_first_traverser *)this_01);
            bVar1 = group::depth_first_traverser::operator_cast_to_bool
                              ((depth_first_traverser *)0x19c26a);
            if (!bVar1) {
              return_to_outermost_scope(in_RDI);
            }
          }
        }
      }
      check_if_left_scope(this_03);
      local_8 = in_RDI;
    }
  }
  return local_8;
}

Assistant:

scoped_dfs_traverser&
    operator ++ ()
    {
        if(!pos_) return *this;

        if(pos_.is_last_in_path()) {
            return_to_outermost_scope();
            return *this;
        }

        //current pattern can block if it didn't match already
        if(ignoreBlocks_ || matched()) {
            ++pos_;
        }
        else if(!pos_->is_group()) {
            //current group can block if we didn't have any match in it
            const group* g = pos_.outermost_blocking_group_fully_explored();
            //no match in 'g' before -> skip to after its siblings
            if(g && !lastMatch_.is_inside(g)) {
                pos_.back_to_ancestor(g).next_after_siblings();
                if(!pos_) return_to_outermost_scope();
            }
            else if(pos_->blocking()) {
                if(pos_.parent().exclusive()) {
                    pos_.next_sibling();
                } else {
                    //no match => skip siblings of blocking param
                    pos_.next_after_siblings();
                }
                if(!pos_) return_to_outermost_scope();
            } else {
                ++pos_;
            }
        } else {
            ++pos_;
        }
        check_if_left_scope();
        return *this;
    }